

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::emplaceLine<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
          (Section *this,string *label,shared_ptr<mocker::nasm::Register> *args)

{
  shared_ptr<mocker::nasm::Push> local_30;
  shared_ptr<mocker::nasm::Register> *local_20;
  shared_ptr<mocker::nasm::Register> *args_local;
  string *label_local;
  Section *this_local;
  
  local_20 = args;
  args_local = (shared_ptr<mocker::nasm::Register> *)label;
  label_local = &this->name;
  std::make_shared<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
            ((shared_ptr<mocker::nasm::Register> *)&local_30);
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::Push>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             &local_30);
  std::shared_ptr<mocker::nasm::Push>::~shared_ptr(&local_30);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }